

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void do_crop(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
            JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
            jvirt_barray_ptr *dst_coef_arrays)

{
  int iVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  uint uVar4;
  JBLOCKARRAY ppaJVar6;
  JBLOCKARRAY ppaJVar7;
  long lVar8;
  long lVar9;
  int iVar5;
  
  if (0 < dstinfo->num_components) {
    lVar9 = 0;
    do {
      pjVar3 = dstinfo->comp_info;
      if (pjVar3[lVar9].height_in_blocks != 0) {
        iVar1 = pjVar3[lVar9].v_samp_factor;
        iVar2 = pjVar3[lVar9].h_samp_factor;
        uVar4 = 0;
        do {
          ppaJVar6 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,dst_coef_arrays[lVar9],uVar4,
                                pjVar3[lVar9].v_samp_factor,1);
          ppaJVar7 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,src_coef_arrays[lVar9],
                                iVar1 * y_crop_offset + uVar4,pjVar3[lVar9].v_samp_factor,0);
          iVar5 = pjVar3[lVar9].v_samp_factor;
          if (0 < iVar5) {
            lVar8 = 0;
            do {
              jcopy_block_row(ppaJVar7[lVar8] + iVar2 * x_crop_offset,ppaJVar6[lVar8],
                              pjVar3[lVar9].width_in_blocks);
              lVar8 = lVar8 + 1;
              iVar5 = pjVar3[lVar9].v_samp_factor;
            } while (lVar8 < iVar5);
          }
          uVar4 = iVar5 + uVar4;
        } while (uVar4 < pjVar3[lVar9].height_in_blocks);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < dstinfo->num_components);
  }
  return;
}

Assistant:

LOCAL(void)
do_crop(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
        JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
        jvirt_barray_ptr *src_coef_arrays,
        jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop. */
{
  JDIMENSION dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  jpeg_component_info *compptr;

  /* We simply have to copy the right amount of data (the destination's
   * image size) starting at the given X and Y offsets in the source.
   */
  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      src_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], dst_blk_y + y_crop_blocks,
         (JDIMENSION)compptr->v_samp_factor, FALSE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        jcopy_block_row(src_buffer[offset_y] + x_crop_blocks,
                        dst_buffer[offset_y], compptr->width_in_blocks);
      }
    }
  }
}